

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_9eb85::CleanTestCleanFailure::Run(CleanTestCleanFailure *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Test *this_01;
  int iVar1;
  Cleaner cleaner;
  Cleaner local_c8;
  
  iVar1 = g_current_test->assertion_failures_;
  state = &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,"build dir: cat src1\n",(ManifestParserOptions)0x0);
  if (iVar1 == g_current_test->assertion_failures_) {
    local_c8.state_ = (State *)&local_c8.dyndep_loader_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"dir","");
    this_00 = &(this->super_CleanTest).fs_;
    VirtualFileSystem::MakeDir(this_00,(string *)&local_c8);
    if (local_c8.state_ != (State *)&local_c8.dyndep_loader_) {
      operator_delete(local_c8.state_,
                      (ulong)((long)&((local_c8.dyndep_loader_.state_)->paths_)._M_h + 1));
    }
    Cleaner::Cleaner(&local_c8,state,&(this->super_CleanTest).config_,&this_00->super_DiskInterface)
    ;
    this_01 = g_current_test;
    iVar1 = Cleaner::CleanAll(&local_c8,false);
    testing::Test::Check
              (this_01,iVar1 != 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x19b,"0 != cleaner.CleanAll()");
    std::
    _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
    ~_Rb_tree(&local_c8.cleaned_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_c8.removed_._M_t);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanFailure) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
                                      "build dir: cat src1\n"));
  fs_.MakeDir("dir");
  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_NE(0, cleaner.CleanAll());
}